

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode.c
# Opt level: O0

mmt_buf * find_ptr(uint64_t ptr,mmt_memory_dump *args,int argc)

{
  int local_28;
  int i;
  int argc_local;
  mmt_memory_dump *args_local;
  uint64_t ptr_local;
  
  if (ptr != 0) {
    for (local_28 = 0; local_28 < argc; local_28 = local_28 + 1) {
      if (args[local_28].addr == ptr) {
        return args[local_28].data;
      }
    }
  }
  return (mmt_buf *)0x0;
}

Assistant:

struct mmt_buf *find_ptr(uint64_t ptr, struct mmt_memory_dump *args, int argc)
{
	int i;
	if (!ptr)
		return NULL;
	for (i = 0; i < argc; ++i)
		if (args[i].addr == ptr)
			return args[i].data;

	return NULL;
}